

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>_>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>_>
                   *this)

{
  undefined1 *__ptr;
  
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_false>
  ::destroy_range((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
                   *)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_void>
                     .super_SmallVectorBase.BeginX,
                  (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
                   *)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_void>
                     .super_SmallVectorBase.EndX);
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_false>
          ).
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_void>
          .super_SmallVectorBase.BeginX;
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>,_void>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }